

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

stumpless_entry *
stumpless_set_entry_param_by_index
          (stumpless_entry *entry,size_t element_index,size_t param_index,stumpless_param *param)

{
  stumpless_element *psVar1;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
  }
  else {
    lock_entry(entry);
    psVar1 = locked_get_element_by_index(entry,element_index);
    unlock_entry(entry);
    if (psVar1 != (stumpless_element *)0x0) {
      psVar1 = stumpless_set_param(psVar1,param_index,param);
      if (psVar1 != (stumpless_element *)0x0) {
        return entry;
      }
      return (stumpless_entry *)0x0;
    }
  }
  return (stumpless_entry *)0x0;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_param_by_index( struct stumpless_entry *entry,
                                    size_t element_index,
                                    size_t param_index,
                                    struct stumpless_param *param ) {
  struct stumpless_element *element;
  const struct stumpless_element *set_result;

  VALIDATE_ARG_NOT_NULL( entry );

  lock_entry( entry );
  element = locked_get_element_by_index( entry, element_index );
  unlock_entry( entry );

  if( !element ) {
    return NULL;
  }

  set_result = stumpless_set_param( element, param_index, param );
  if( !set_result ) {
    return NULL;
  }

  return entry;
}